

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::load(Application *this,SceneInfo *sceneInfo)

{
  Type TVar1;
  ulong uVar2;
  undefined1 uVar3;
  size_type sVar4;
  Scene *phi;
  long in_RSI;
  Application *in_RDI;
  double maxViewDistance;
  double minViewDistance;
  double viewDistance;
  Vector3D target;
  BBox bbox;
  Matrix4x4 *transform;
  Instance *instance;
  Node *node;
  size_t i;
  vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_> *nodes;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  objects;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  lights;
  Vector3D camDir;
  Vector3D camPos;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *in_stack_000002a8;
  CameraInfo *camInfo;
  Vector4D *in_stack_fffffffffffffd38;
  Matrix4x4 *in_stack_fffffffffffffd40;
  CameraInfo *in_stack_fffffffffffffd48;
  Application *in_stack_fffffffffffffd50;
  PolymeshInfo *in_stack_fffffffffffffd58;
  double minR;
  Application *in_stack_fffffffffffffd60;
  double r;
  undefined7 in_stack_fffffffffffffd68;
  SceneObject *in_stack_fffffffffffffd78;
  Camera *in_stack_fffffffffffffd80;
  Application *in_stack_fffffffffffffd88;
  Matrix4x4 *in_stack_fffffffffffffd90;
  Matrix4x4 *pMVar5;
  Scene *in_stack_fffffffffffffdb8;
  BBox local_218;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  Matrix4x4 *in_stack_fffffffffffffe38;
  Vector4D local_188 [2];
  double local_130;
  double dStack_128;
  double local_120;
  Vector4D local_108 [2];
  double local_c8;
  double dStack_c0;
  double local_b8;
  Application *local_b0;
  Instance *local_a8;
  reference local_a0;
  ulong local_98;
  vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_> *local_90;
  Vector3D local_58;
  Vector3D local_38;
  Instance *local_18;
  long local_10;
  
  local_10 = in_RSI;
  Vector3D::Vector3D(&local_38);
  Vector3D::Vector3D(&local_58);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::vector((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)0x1cadcb);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  vector((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)0x1cadd8);
  local_90 = (vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_> *)
             (local_10 + 0x20);
  for (local_98 = 0; uVar2 = local_98,
      sVar4 = std::vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>::size
                        (local_90), uVar2 < sVar4; local_98 = local_98 + 1) {
    local_a0 = std::vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>::operator[]
                         (local_90,local_98);
    local_a8 = local_a0->instance;
    pMVar5 = &local_a0->transform;
    TVar1 = local_a8->type;
    local_b0 = (Application *)pMVar5;
    if (TVar1 == CAMERA) {
      local_18 = local_a8;
      Vector4D::Vector4D(local_108,(Vector3D *)(local_a8 + 1),1.0);
      Matrix4x4::operator*
                (in_stack_fffffffffffffe38,
                 (Vector4D *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
      Vector4D::to3D(in_stack_fffffffffffffd38);
      local_38.z = local_b8;
      local_38.x = local_c8;
      local_38.y = dStack_c0;
      in_stack_fffffffffffffd88 = local_b0;
      Vector4D::Vector4D(local_188,(Vector3D *)&local_18[1].id.field_2,1.0);
      Matrix4x4::operator*
                (in_stack_fffffffffffffe38,
                 (Vector4D *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
      Vector4D::to3D(in_stack_fffffffffffffd38);
      Vector3D::unit((Vector3D *)in_stack_fffffffffffffd58);
      local_58.z = local_120;
      local_58.x = local_130;
      local_58.y = dStack_128;
      initCamera(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      in_stack_fffffffffffffd90 = pMVar5;
    }
    else if (TVar1 == LIGHT) {
      in_stack_fffffffffffffd80 =
           (Camera *)
           initLight(in_stack_fffffffffffffd88,(LightInfo *)in_stack_fffffffffffffd80,
                     (Matrix4x4 *)in_stack_fffffffffffffd78);
      std::
      vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
      ::push_back((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
                   *)in_stack_fffffffffffffd40,(value_type *)in_stack_fffffffffffffd38);
    }
    else if (TVar1 == POLYMESH) {
      in_stack_fffffffffffffd78 =
           initPolymesh(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                        (Matrix4x4 *)in_stack_fffffffffffffd50);
      std::
      vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
      ::push_back((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                   *)in_stack_fffffffffffffd40,(value_type *)in_stack_fffffffffffffd38);
    }
  }
  phi = (Scene *)operator_new(0x630);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  vector((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)in_stack_fffffffffffffd90,
         (vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)in_stack_fffffffffffffd88);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::vector((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)in_stack_fffffffffffffd90,
           (vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)in_stack_fffffffffffffd88);
  DynamicScene::Scene::Scene
            ((Scene *)camInfo,in_stack_000002a8,
             (vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
              *)camPos.z,(string *)camPos.y);
  in_RDI->scene = phi;
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::~vector((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
             *)in_stack_fffffffffffffd50);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  ~vector((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
           *)in_stack_fffffffffffffd50);
  DynamicScene::Scene::setCamera(in_RDI->scene,&in_RDI->camera);
  DynamicScene::Scene::getBBox(in_stack_fffffffffffffdb8);
  uVar3 = BBox::empty(&local_218);
  if (!(bool)uVar3) {
    BBox::centroid((BBox *)CONCAT17(uVar3,in_stack_fffffffffffffd68));
    r = Vector3D::norm((Vector3D *)0x1cb1bc);
    in_RDI->canonicalViewDistance = r * 0.5 * 1.5;
    in_stack_fffffffffffffd50 = (Application *)&in_RDI->canonicalCamera;
    minR = acos(local_58.y);
    atan2(local_58.x,local_58.z);
    Camera::place(in_stack_fffffffffffffd80,(Vector3D *)in_stack_fffffffffffffd78,(double)phi,
                  (double)CONCAT17(uVar3,in_stack_fffffffffffffd68),r,minR,
                  (double)in_stack_fffffffffffffd50);
    if ((local_18[2].id._M_string_length & 1) == 0) {
      Vector3D::norm((Vector3D *)0x1cb2ec);
    }
    acos(local_58.y);
    atan2(local_58.x,local_58.z);
    Camera::place(in_stack_fffffffffffffd80,(Vector3D *)in_stack_fffffffffffffd78,(double)phi,
                  (double)CONCAT17(uVar3,in_stack_fffffffffffffd68),r,minR,
                  (double)in_stack_fffffffffffffd50);
    setScrollRate(in_RDI);
  }
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  ~vector((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
           *)in_stack_fffffffffffffd50);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::~vector((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
             *)in_stack_fffffffffffffd50);
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

    // save camera position to update camera control later
    CameraInfo* camInfo;
    Vector3D camPos, camDir;
 
    vector<DynamicScene::SceneLight*> lights;
    vector<DynamicScene::SceneObject*> objects;

    vector<Collada::Node>& nodes = sceneInfo->nodes;

    for (size_t i=0; i<nodes.size(); i++) {
        Collada::Node& node = nodes[i];
        Collada::Instance* instance = node.instance;
        const Matrix4x4& transform = node.transform;

        switch (instance->type) {
          case Collada::Instance::CAMERA: {
              // printf("Creating camera\n"); fflush(stdout);
              camInfo = static_cast<CameraInfo*>(instance);
              camPos = (transform * Vector4D(camInfo->pos, 1)).to3D();
              camDir = (transform * Vector4D(camInfo->view_dir, 1)).to3D().unit();
              initCamera(*camInfo, transform);
              break;
          }
          case Collada::Instance::LIGHT: {
              // printf("Creating light\n"); fflush(stdout);  
              lights.push_back(
                  initLight(static_cast<LightInfo&>(*instance), transform));
              break;
          }
          case Collada::Instance::POLYMESH: {
              // printf("Creating mesh\n"); fflush(stdout);  
              objects.push_back(
                  initPolymesh(static_cast<PolymeshInfo&>(*instance), transform));
              break;
          }
        default:
            // unsupported instance type
            break;
        }
    }

    // create the scene
    scene = new DynamicScene::Scene(objects, lights, sceneInfo->base_shader_dir);
    scene->setCamera(&camera);  

    // given the size of the scene, determine a "canonical" camera position that's
    // outside the bounds of the scene's geometry
    BBox bbox = scene->getBBox();
    if (!bbox.empty()) {
        Vector3D target = bbox.centroid();
        canonicalViewDistance = bbox.extent.norm() / 2.0 * 1.5;

        double viewDistance = canonicalViewDistance * 2;
        double minViewDistance = canonicalViewDistance / 10.0;
        double maxViewDistance = canonicalViewDistance * 20.0;

      	canonicalCamera.place(target, acos(camDir.y), atan2(camDir.x, camDir.z),
                              viewDistance, minViewDistance, maxViewDistance);

    	  if (!camInfo->default_flag) {
		        target = camPos;
		        viewDistance = camInfo->view_dir.norm();
        }

        camera.place(target, acos(camDir.y), atan2(camDir.x, camDir.z),
                     viewDistance, minViewDistance, maxViewDistance);

        setScrollRate();
    }
}